

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::expanded_convert(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint8 *puVar8;
  long lVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  int k;
  long lVar12;
  uint8 *puVar13;
  int iVar14;
  
  uVar6 = this->m_max_mcu_y_size - this->m_mcu_lines_left;
  puVar11 = this->m_pSample_buf +
            (ulong)(uVar6 & 7) * 8 + (long)this->m_comp_h_samp[0] * (long)((int)uVar6 / 8) * 0x40;
  puVar8 = this->m_pScan_line_0;
  for (iVar7 = this->m_max_mcus_per_row; 0 < iVar7; iVar7 = iVar7 + -1) {
    puVar10 = puVar11;
    for (lVar12 = 0; lVar12 < this->m_max_mcu_x_size; lVar12 = lVar12 + 8) {
      iVar4 = this->m_expanded_blocks_per_component;
      puVar13 = puVar8;
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        bVar1 = puVar10[lVar9];
        bVar2 = puVar10[lVar9 + (iVar4 << 7)];
        iVar5 = this->m_crr[bVar2] + (uint)bVar1;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        bVar3 = puVar10[lVar9 + (iVar4 << 6)];
        puVar8[lVar9 * 4] = (uint8)iVar5;
        iVar5 = (this->m_cbg[bVar3] + this->m_crg[bVar2] >> 0x10) + (uint)bVar1;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        puVar8[lVar9 * 4 + 1] = (uint8)iVar5;
        iVar14 = (uint)bVar1 + this->m_cbb[bVar3];
        iVar5 = 0;
        if (0 < iVar14) {
          iVar5 = iVar14;
        }
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        puVar8[lVar9 * 4 + 2] = (uint8)iVar5;
        puVar8[lVar9 * 4 + 3] = 0xff;
        puVar13 = puVar13 + 4;
      }
      puVar10 = puVar10 + 0x40;
      puVar8 = puVar13;
    }
    puVar11 = puVar11 + (long)this->m_expanded_blocks_per_mcu * 0x40;
  }
  return;
}

Assistant:

void jpeg_decoder::expanded_convert()
{
  int row = m_max_mcu_y_size - m_mcu_lines_left;

  uint8* Py = m_pSample_buf + (row / 8) * 64 * m_comp_h_samp[0] + (row & 7) * 8;

  uint8* d = m_pScan_line_0;

  for (int i = m_max_mcus_per_row; i > 0; i--)
  {
    for (int k = 0; k < m_max_mcu_x_size; k += 8)
    {
      const int Y_ofs = k * 8;
      const int Cb_ofs = Y_ofs + 64 * m_expanded_blocks_per_component;
      const int Cr_ofs = Y_ofs + 64 * m_expanded_blocks_per_component * 2;
      for (int j = 0; j < 8; j++)
      {
        int y = Py[Y_ofs + j];
        int cb = Py[Cb_ofs + j];
        int cr = Py[Cr_ofs + j];

        d[0] = clamp(y + m_crr[cr]);
        d[1] = clamp(y + ((m_crg[cr] + m_cbg[cb]) >> 16));
        d[2] = clamp(y + m_cbb[cb]);
        d[3] = 255;

        d += 4;
      }
    }

    Py += 64 * m_expanded_blocks_per_mcu;
  }
}